

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadU16(BinaryReader *this,uint16_t *out_value,char *desc)

{
  Result RVar1;
  char *desc_local;
  uint16_t *out_value_local;
  BinaryReader *this_local;
  
  RVar1 = ReadT<unsigned_short>(this,out_value,"uint16_t",desc);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReader::ReadU16(uint16_t* out_value, const char* desc) {
  return ReadT(out_value, "uint16_t", desc);
}